

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O1

int disposition_set_settled(DISPOSITION_HANDLE disposition,_Bool settled_value)

{
  int iVar1;
  AMQP_VALUE item_value;
  int iVar2;
  DISPOSITION_INSTANCE *disposition_instance;
  
  if (disposition == (DISPOSITION_HANDLE)0x0) {
    iVar2 = 0x22af;
  }
  else {
    item_value = amqpvalue_create_boolean(settled_value);
    if (item_value == (AMQP_VALUE)0x0) {
      iVar2 = 0x22b7;
    }
    else {
      iVar1 = amqpvalue_set_composite_item(disposition->composite_value,3,item_value);
      iVar2 = 0x22bd;
      if (iVar1 == 0) {
        iVar2 = 0;
      }
      amqpvalue_destroy(item_value);
    }
  }
  return iVar2;
}

Assistant:

int disposition_set_settled(DISPOSITION_HANDLE disposition, bool settled_value)
{
    int result;

    if (disposition == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        DISPOSITION_INSTANCE* disposition_instance = (DISPOSITION_INSTANCE*)disposition;
        AMQP_VALUE settled_amqp_value = amqpvalue_create_boolean(settled_value);
        if (settled_amqp_value == NULL)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (amqpvalue_set_composite_item(disposition_instance->composite_value, 3, settled_amqp_value) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }

            amqpvalue_destroy(settled_amqp_value);
        }
    }

    return result;
}